

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicSpline.hpp
# Opt level: O0

void __thiscall OpenMD::CubicSpline::~CubicSpline(CubicSpline *this)

{
  CubicSpline *in_RDI;
  
  ~CubicSpline(in_RDI);
  operator_delete(in_RDI,0xa0);
  return;
}

Assistant:

virtual ~CubicSpline() {}